

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall
kratos::Simulator::set_i
          (Simulator *this,Var *var,optional<std::vector<long,_std::allocator<long>_>_> *value,
          bool eval_)

{
  pointer __file;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 auVar3 [8];
  undefined1 local_90 [8];
  vector<long,_std::allocator<long>_> vs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> u_vs;
  uint64_t u_v;
  
  if ((value->super__Optional_base<std::vector<long,_std::allocator<long>_>,_false,_false>).
      _M_payload.
      super__Optional_payload<std::vector<long,_std::allocator<long>_>,_true,_false,_false>.
      super__Optional_payload_base<std::vector<long,_std::allocator<long>_>_>._M_engaged == true) {
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_90,
               (vector<long,_std::allocator<long>_> *)value);
    vs.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &vs.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,
               (long)vs.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start - (long)local_90 >> 3);
    for (auVar3 = local_90;
        auVar3 != (undefined1  [8])
                  vs.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                  ._M_start; auVar3 = (undefined1  [8])((long)auVar3 + 8)) {
      __file = (pointer)**(undefined8 **)auVar3;
      u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __file;
      uVar1 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
      iVar2 = truncate((char *)__file,(ulong)uVar1);
      u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                 &vs.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage,
                 (unsigned_long *)
                 &u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    std::_Optional_payload_base<std::vector<unsigned_long,std::allocator<unsigned_long>>>::
    _Optional_payload_base<std::vector<unsigned_long,std::allocator<unsigned_long>>&>
              ((_Optional_payload_base<std::vector<unsigned_long,std::allocator<unsigned_long>>> *)
               &u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               &vs.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    set_complex_value_(this,var,(optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)&u_vs.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
    _M_reset((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &u_vs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    if (eval_) {
      eval(this);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &vs.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)local_90);
  }
  return;
}

Assistant:

void Simulator::set_i(const kratos::Var *var, const std::optional<std::vector<int64_t>> &value,
                      bool eval_) {
    if (value) {
        auto vs = *value;
        std::vector<uint64_t> u_vs;
        u_vs.reserve(vs.size());
        for (auto v : vs) {
            auto u_v = *(reinterpret_cast<uint64_t *>(v));
            u_v = truncate(u_v, var->width());
            u_vs.emplace_back(u_v);
        }
        set_complex_value_(var, u_vs);
        if (eval_) eval();
    }
}